

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

void __thiscall QSocks5BindStore::QSocks5BindStore(QSocks5BindStore *this)

{
  QCoreApplication *pQVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  QRecursiveMutex *in_RDI;
  QCoreApplication *app;
  
  QObject::QObject((QObject *)in_RDI,(QObject *)0x0);
  (in_RDI->owner).super_QBasicAtomicPointer<void>._q_value._M_b._M_p = &PTR_metaObject_0049fa48;
  QRecursiveMutex::QRecursiveMutex(in_RDI);
  QBasicTimer::QBasicTimer((QBasicTimer *)&in_RDI[1].mutex);
  QHash<long_long,_QSocks5BindData_*>::QHash((QHash<long_long,_QSocks5BindData_*> *)(in_RDI + 2));
  pQVar1 = QCoreApplication::instance();
  if (pQVar1 != (QCoreApplication *)0x0) {
    lVar2 = QObject::thread();
    lVar3 = QObject::thread();
    if (lVar2 != lVar3) {
      uVar4 = QObject::thread();
      QObject::moveToThread(in_RDI,uVar4);
    }
  }
  return;
}

Assistant:

QSocks5BindStore::QSocks5BindStore()
{
    QCoreApplication *app = QCoreApplication::instance();
    if (app && app->thread() != thread())
        moveToThread(app->thread());
}